

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct32_stage8_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  uint uVar49;
  undefined4 uVar50;
  char in_DL;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  undefined2 local_a48;
  undefined2 uStack_a46;
  undefined2 uStack_a44;
  undefined2 uStack_a42;
  undefined2 local_a38;
  undefined2 uStack_a36;
  undefined2 uStack_a34;
  undefined2 uStack_a32;
  undefined2 local_a28;
  undefined2 uStack_a26;
  undefined2 uStack_a24;
  undefined2 uStack_a22;
  undefined2 local_a18;
  undefined2 uStack_a16;
  undefined2 uStack_a14;
  undefined2 uStack_a12;
  undefined2 local_a08;
  undefined2 uStack_a06;
  undefined2 uStack_a04;
  undefined2 uStack_a02;
  undefined2 local_9f8;
  undefined2 uStack_9f6;
  undefined2 uStack_9f4;
  undefined2 uStack_9f2;
  undefined2 local_9e8;
  undefined2 uStack_9e6;
  undefined2 uStack_9e4;
  undefined2 uStack_9e2;
  undefined2 local_9d8;
  undefined2 uStack_9d6;
  undefined2 uStack_9d4;
  undefined2 uStack_9d2;
  undefined2 uStack_9c0;
  undefined2 uStack_9be;
  undefined2 uStack_9bc;
  undefined2 uStack_9ba;
  undefined2 uStack_9b0;
  undefined2 uStack_9ae;
  undefined2 uStack_9ac;
  undefined2 uStack_9aa;
  undefined2 uStack_9a0;
  undefined2 uStack_99e;
  undefined2 uStack_99c;
  undefined2 uStack_99a;
  undefined2 uStack_990;
  undefined2 uStack_98e;
  undefined2 uStack_98c;
  undefined2 uStack_98a;
  undefined2 uStack_980;
  undefined2 uStack_97e;
  undefined2 uStack_97c;
  undefined2 uStack_97a;
  undefined2 uStack_970;
  undefined2 uStack_96e;
  undefined2 uStack_96c;
  undefined2 uStack_96a;
  undefined2 uStack_960;
  undefined2 uStack_95e;
  undefined2 uStack_95c;
  undefined2 uStack_95a;
  undefined2 uStack_950;
  undefined2 uStack_94e;
  undefined2 uStack_94c;
  undefined2 uStack_94a;
  int local_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  int local_718;
  int iStack_714;
  int iStack_710;
  int iStack_70c;
  int local_6f8;
  int iStack_6f4;
  int iStack_6f0;
  int iStack_6ec;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int local_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  int local_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  int local_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  int local_638;
  int iStack_634;
  int iStack_630;
  int iStack_62c;
  int local_618;
  int iStack_614;
  int iStack_610;
  int iStack_60c;
  int local_5f8;
  int iStack_5f4;
  int iStack_5f0;
  int iStack_5ec;
  int local_5d8;
  int iStack_5d4;
  int iStack_5d0;
  int iStack_5cc;
  int local_5b8;
  int iStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  int local_598;
  int iStack_594;
  int iStack_590;
  int iStack_58c;
  int local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  int local_568;
  int iStack_564;
  int iStack_560;
  int iStack_55c;
  int local_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  
  uVar49 = -*(int *)(in_RSI + 0x80) & 0xffffU | *(int *)(in_RSI + 0x80) << 0x10;
  uVar45 = CONCAT44(uVar49,uVar49);
  uVar46 = CONCAT44(uVar49,uVar49);
  uVar50 = CONCAT22(*(undefined2 *)(in_RSI + 0x80),*(undefined2 *)(in_RSI + 0x80));
  uVar47 = CONCAT44(uVar50,uVar50);
  uVar48 = CONCAT44(uVar50,uVar50);
  auVar52 = *in_RDI;
  auVar51 = paddsw(*in_RDI,in_RDI[0xf]);
  *in_RDI = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0xf]);
  in_RDI[0xf] = auVar52;
  auVar52 = in_RDI[1];
  auVar51 = paddsw(in_RDI[1],in_RDI[0xe]);
  in_RDI[1] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0xe]);
  in_RDI[0xe] = auVar52;
  auVar52 = in_RDI[2];
  auVar51 = paddsw(in_RDI[2],in_RDI[0xd]);
  in_RDI[2] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0xd]);
  in_RDI[0xd] = auVar52;
  auVar52 = in_RDI[3];
  auVar51 = paddsw(in_RDI[3],in_RDI[0xc]);
  in_RDI[3] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0xc]);
  in_RDI[0xc] = auVar52;
  auVar52 = in_RDI[4];
  auVar51 = paddsw(in_RDI[4],in_RDI[0xb]);
  in_RDI[4] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0xb]);
  in_RDI[0xb] = auVar52;
  auVar52 = in_RDI[5];
  auVar51 = paddsw(in_RDI[5],in_RDI[10]);
  in_RDI[5] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[10]);
  in_RDI[10] = auVar52;
  auVar52 = in_RDI[6];
  auVar51 = paddsw(in_RDI[6],in_RDI[9]);
  in_RDI[6] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[9]);
  in_RDI[9] = auVar52;
  auVar52 = in_RDI[7];
  auVar51 = paddsw(in_RDI[7],in_RDI[8]);
  in_RDI[7] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[8]);
  in_RDI[8] = auVar52;
  uVar1 = *(undefined8 *)in_RDI[0x14];
  uVar2 = *(undefined8 *)in_RDI[0x1b];
  local_9d8 = (undefined2)uVar1;
  uStack_9d6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_9d4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_9d2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_9e8 = (undefined2)uVar2;
  uStack_9e6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_9e4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_9e2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x14] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x1b] + 8);
  uStack_950 = (undefined2)uVar1;
  uStack_94e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_94c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_94a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_960 = (undefined2)uVar2;
  uStack_95e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_95c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_95a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar28._2_2_ = local_9e8;
  auVar28._0_2_ = local_9d8;
  auVar28._4_2_ = uStack_9d6;
  auVar28._6_2_ = uStack_9e6;
  auVar28._10_2_ = uStack_9e4;
  auVar28._8_2_ = uStack_9d4;
  auVar28._12_2_ = uStack_9d2;
  auVar28._14_2_ = uStack_9e2;
  auVar27._8_8_ = uVar46;
  auVar27._0_8_ = uVar45;
  auVar52 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_960;
  auVar26._0_2_ = uStack_950;
  auVar26._4_2_ = uStack_94e;
  auVar26._6_2_ = uStack_95e;
  auVar26._10_2_ = uStack_95c;
  auVar26._8_2_ = uStack_94c;
  auVar26._12_2_ = uStack_94a;
  auVar26._14_2_ = uStack_95a;
  auVar25._8_8_ = uVar46;
  auVar25._0_8_ = uVar45;
  auVar51 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_9e8;
  auVar24._0_2_ = local_9d8;
  auVar24._4_2_ = uStack_9d6;
  auVar24._6_2_ = uStack_9e6;
  auVar24._10_2_ = uStack_9e4;
  auVar24._8_2_ = uStack_9d4;
  auVar24._12_2_ = uStack_9d2;
  auVar24._14_2_ = uStack_9e2;
  auVar23._8_8_ = uVar48;
  auVar23._0_8_ = uVar47;
  auVar53 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_960;
  auVar22._0_2_ = uStack_950;
  auVar22._4_2_ = uStack_94e;
  auVar22._6_2_ = uStack_95e;
  auVar22._10_2_ = uStack_95c;
  auVar22._8_2_ = uStack_94c;
  auVar22._12_2_ = uStack_94a;
  auVar22._14_2_ = uStack_95a;
  auVar21._8_8_ = uVar48;
  auVar21._0_8_ = uVar47;
  auVar54 = pmaddwd(auVar22,auVar21);
  local_558 = auVar52._0_4_;
  iStack_554 = auVar52._4_4_;
  iStack_550 = auVar52._8_4_;
  iStack_54c = auVar52._12_4_;
  local_568 = (int)in_XMM0_Qa;
  iStack_564 = (int)((ulong)in_XMM0_Qa >> 0x20);
  iStack_560 = (int)in_XMM0_Qb;
  iStack_55c = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_578 = auVar51._0_4_;
  iStack_574 = auVar51._4_4_;
  iStack_570 = auVar51._8_4_;
  iStack_56c = auVar51._12_4_;
  local_598 = auVar53._0_4_;
  iStack_594 = auVar53._4_4_;
  iStack_590 = auVar53._8_4_;
  iStack_58c = auVar53._12_4_;
  local_5b8 = auVar54._0_4_;
  iStack_5b4 = auVar54._4_4_;
  iStack_5b0 = auVar54._8_4_;
  iStack_5ac = auVar54._12_4_;
  auVar52 = ZEXT416((uint)(int)in_DL);
  auVar51 = ZEXT416((uint)(int)in_DL);
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar44._4_4_ = iStack_554 + iStack_564 >> auVar52;
  auVar44._0_4_ = local_558 + local_568 >> auVar52;
  auVar44._12_4_ = iStack_54c + iStack_55c >> auVar52;
  auVar44._8_4_ = iStack_550 + iStack_560 >> auVar52;
  auVar43._4_4_ = iStack_574 + iStack_564 >> auVar51;
  auVar43._0_4_ = local_578 + local_568 >> auVar51;
  auVar43._12_4_ = iStack_56c + iStack_55c >> auVar51;
  auVar43._8_4_ = iStack_570 + iStack_560 >> auVar51;
  auVar52 = packssdw(auVar44,auVar43);
  in_RDI[0x14] = auVar52;
  auVar42._4_4_ = iStack_594 + iStack_564 >> auVar53;
  auVar42._0_4_ = local_598 + local_568 >> auVar53;
  auVar42._12_4_ = iStack_58c + iStack_55c >> auVar53;
  auVar42._8_4_ = iStack_590 + iStack_560 >> auVar53;
  auVar41._4_4_ = iStack_5b4 + iStack_564 >> auVar54;
  auVar41._0_4_ = local_5b8 + local_568 >> auVar54;
  auVar41._12_4_ = iStack_5ac + iStack_55c >> auVar54;
  auVar41._8_4_ = iStack_5b0 + iStack_560 >> auVar54;
  auVar52 = packssdw(auVar42,auVar41);
  in_RDI[0x1b] = auVar52;
  uVar1 = *(undefined8 *)in_RDI[0x15];
  uVar2 = *(undefined8 *)in_RDI[0x1a];
  local_9f8 = (undefined2)uVar1;
  uStack_9f6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_9f4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_9f2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_a08 = (undefined2)uVar2;
  uStack_a06 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_a04 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_a02 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x15] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x1a] + 8);
  uStack_970 = (undefined2)uVar1;
  uStack_96e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_96c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_96a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_980 = (undefined2)uVar2;
  uStack_97e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_97c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_97a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar20._2_2_ = local_a08;
  auVar20._0_2_ = local_9f8;
  auVar20._4_2_ = uStack_9f6;
  auVar20._6_2_ = uStack_a06;
  auVar20._10_2_ = uStack_a04;
  auVar20._8_2_ = uStack_9f4;
  auVar20._12_2_ = uStack_9f2;
  auVar20._14_2_ = uStack_a02;
  auVar19._8_8_ = uVar46;
  auVar19._0_8_ = uVar45;
  auVar52 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_980;
  auVar18._0_2_ = uStack_970;
  auVar18._4_2_ = uStack_96e;
  auVar18._6_2_ = uStack_97e;
  auVar18._10_2_ = uStack_97c;
  auVar18._8_2_ = uStack_96c;
  auVar18._12_2_ = uStack_96a;
  auVar18._14_2_ = uStack_97a;
  auVar17._8_8_ = uVar46;
  auVar17._0_8_ = uVar45;
  auVar51 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_a08;
  auVar16._0_2_ = local_9f8;
  auVar16._4_2_ = uStack_9f6;
  auVar16._6_2_ = uStack_a06;
  auVar16._10_2_ = uStack_a04;
  auVar16._8_2_ = uStack_9f4;
  auVar16._12_2_ = uStack_9f2;
  auVar16._14_2_ = uStack_a02;
  auVar15._8_8_ = uVar48;
  auVar15._0_8_ = uVar47;
  auVar53 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_980;
  auVar14._0_2_ = uStack_970;
  auVar14._4_2_ = uStack_96e;
  auVar14._6_2_ = uStack_97e;
  auVar14._10_2_ = uStack_97c;
  auVar14._8_2_ = uStack_96c;
  auVar14._12_2_ = uStack_96a;
  auVar14._14_2_ = uStack_97a;
  auVar13._8_8_ = uVar48;
  auVar13._0_8_ = uVar47;
  auVar54 = pmaddwd(auVar14,auVar13);
  local_5d8 = auVar52._0_4_;
  iStack_5d4 = auVar52._4_4_;
  iStack_5d0 = auVar52._8_4_;
  iStack_5cc = auVar52._12_4_;
  local_5f8 = auVar51._0_4_;
  iStack_5f4 = auVar51._4_4_;
  iStack_5f0 = auVar51._8_4_;
  iStack_5ec = auVar51._12_4_;
  local_618 = auVar53._0_4_;
  iStack_614 = auVar53._4_4_;
  iStack_610 = auVar53._8_4_;
  iStack_60c = auVar53._12_4_;
  local_638 = auVar54._0_4_;
  iStack_634 = auVar54._4_4_;
  iStack_630 = auVar54._8_4_;
  iStack_62c = auVar54._12_4_;
  auVar52 = ZEXT416((uint)(int)in_DL);
  auVar51 = ZEXT416((uint)(int)in_DL);
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar40._4_4_ = iStack_5d4 + iStack_564 >> auVar52;
  auVar40._0_4_ = local_5d8 + local_568 >> auVar52;
  auVar40._12_4_ = iStack_5cc + iStack_55c >> auVar52;
  auVar40._8_4_ = iStack_5d0 + iStack_560 >> auVar52;
  auVar39._4_4_ = iStack_5f4 + iStack_564 >> auVar51;
  auVar39._0_4_ = local_5f8 + local_568 >> auVar51;
  auVar39._12_4_ = iStack_5ec + iStack_55c >> auVar51;
  auVar39._8_4_ = iStack_5f0 + iStack_560 >> auVar51;
  auVar52 = packssdw(auVar40,auVar39);
  in_RDI[0x15] = auVar52;
  auVar38._4_4_ = iStack_614 + iStack_564 >> auVar53;
  auVar38._0_4_ = local_618 + local_568 >> auVar53;
  auVar38._12_4_ = iStack_60c + iStack_55c >> auVar53;
  auVar38._8_4_ = iStack_610 + iStack_560 >> auVar53;
  auVar37._4_4_ = iStack_634 + iStack_564 >> auVar54;
  auVar37._0_4_ = local_638 + local_568 >> auVar54;
  auVar37._12_4_ = iStack_62c + iStack_55c >> auVar54;
  auVar37._8_4_ = iStack_630 + iStack_560 >> auVar54;
  auVar52 = packssdw(auVar38,auVar37);
  in_RDI[0x1a] = auVar52;
  uVar1 = *(undefined8 *)in_RDI[0x16];
  uVar2 = *(undefined8 *)in_RDI[0x19];
  local_a18 = (undefined2)uVar1;
  uStack_a16 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_a14 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_a12 = (undefined2)((ulong)uVar1 >> 0x30);
  local_a28 = (undefined2)uVar2;
  uStack_a26 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_a24 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_a22 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x16] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x19] + 8);
  uStack_990 = (undefined2)uVar1;
  uStack_98e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_98c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_98a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_9a0 = (undefined2)uVar2;
  uStack_99e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_99c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_99a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_a28;
  auVar12._0_2_ = local_a18;
  auVar12._4_2_ = uStack_a16;
  auVar12._6_2_ = uStack_a26;
  auVar12._10_2_ = uStack_a24;
  auVar12._8_2_ = uStack_a14;
  auVar12._12_2_ = uStack_a12;
  auVar12._14_2_ = uStack_a22;
  auVar11._8_8_ = uVar46;
  auVar11._0_8_ = uVar45;
  auVar52 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_9a0;
  auVar10._0_2_ = uStack_990;
  auVar10._4_2_ = uStack_98e;
  auVar10._6_2_ = uStack_99e;
  auVar10._10_2_ = uStack_99c;
  auVar10._8_2_ = uStack_98c;
  auVar10._12_2_ = uStack_98a;
  auVar10._14_2_ = uStack_99a;
  auVar9._8_8_ = uVar46;
  auVar9._0_8_ = uVar45;
  auVar51 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_a28;
  auVar8._0_2_ = local_a18;
  auVar8._4_2_ = uStack_a16;
  auVar8._6_2_ = uStack_a26;
  auVar8._10_2_ = uStack_a24;
  auVar8._8_2_ = uStack_a14;
  auVar8._12_2_ = uStack_a12;
  auVar8._14_2_ = uStack_a22;
  auVar7._8_8_ = uVar48;
  auVar7._0_8_ = uVar47;
  auVar53 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_9a0;
  auVar6._0_2_ = uStack_990;
  auVar6._4_2_ = uStack_98e;
  auVar6._6_2_ = uStack_99e;
  auVar6._10_2_ = uStack_99c;
  auVar6._8_2_ = uStack_98c;
  auVar6._12_2_ = uStack_98a;
  auVar6._14_2_ = uStack_99a;
  auVar5._8_8_ = uVar48;
  auVar5._0_8_ = uVar47;
  auVar54 = pmaddwd(auVar6,auVar5);
  local_658 = auVar52._0_4_;
  iStack_654 = auVar52._4_4_;
  iStack_650 = auVar52._8_4_;
  iStack_64c = auVar52._12_4_;
  local_678 = auVar51._0_4_;
  iStack_674 = auVar51._4_4_;
  iStack_670 = auVar51._8_4_;
  iStack_66c = auVar51._12_4_;
  local_698 = auVar53._0_4_;
  iStack_694 = auVar53._4_4_;
  iStack_690 = auVar53._8_4_;
  iStack_68c = auVar53._12_4_;
  local_6b8 = auVar54._0_4_;
  iStack_6b4 = auVar54._4_4_;
  iStack_6b0 = auVar54._8_4_;
  iStack_6ac = auVar54._12_4_;
  auVar52 = ZEXT416((uint)(int)in_DL);
  auVar51 = ZEXT416((uint)(int)in_DL);
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar36._4_4_ = iStack_654 + iStack_564 >> auVar52;
  auVar36._0_4_ = local_658 + local_568 >> auVar52;
  auVar36._12_4_ = iStack_64c + iStack_55c >> auVar52;
  auVar36._8_4_ = iStack_650 + iStack_560 >> auVar52;
  auVar35._4_4_ = iStack_674 + iStack_564 >> auVar51;
  auVar35._0_4_ = local_678 + local_568 >> auVar51;
  auVar35._12_4_ = iStack_66c + iStack_55c >> auVar51;
  auVar35._8_4_ = iStack_670 + iStack_560 >> auVar51;
  auVar52 = packssdw(auVar36,auVar35);
  in_RDI[0x16] = auVar52;
  auVar34._4_4_ = iStack_694 + iStack_564 >> auVar53;
  auVar34._0_4_ = local_698 + local_568 >> auVar53;
  auVar34._12_4_ = iStack_68c + iStack_55c >> auVar53;
  auVar34._8_4_ = iStack_690 + iStack_560 >> auVar53;
  auVar33._4_4_ = iStack_6b4 + iStack_564 >> auVar54;
  auVar33._0_4_ = local_6b8 + local_568 >> auVar54;
  auVar33._12_4_ = iStack_6ac + iStack_55c >> auVar54;
  auVar33._8_4_ = iStack_6b0 + iStack_560 >> auVar54;
  auVar52 = packssdw(auVar34,auVar33);
  in_RDI[0x19] = auVar52;
  uVar1 = *(undefined8 *)in_RDI[0x17];
  uVar2 = *(undefined8 *)in_RDI[0x18];
  local_a38 = (undefined2)uVar1;
  uStack_a36 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_a34 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_a32 = (undefined2)((ulong)uVar1 >> 0x30);
  local_a48 = (undefined2)uVar2;
  uStack_a46 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_a44 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_a42 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x17] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x18] + 8);
  uStack_9b0 = (undefined2)uVar1;
  uStack_9ae = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_9ac = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_9aa = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_9c0 = (undefined2)uVar2;
  uStack_9be = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_9bc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_9ba = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_a48;
  auVar4._0_2_ = local_a38;
  auVar4._4_2_ = uStack_a36;
  auVar4._6_2_ = uStack_a46;
  auVar4._10_2_ = uStack_a44;
  auVar4._8_2_ = uStack_a34;
  auVar4._12_2_ = uStack_a32;
  auVar4._14_2_ = uStack_a42;
  auVar55._8_8_ = uVar46;
  auVar55._0_8_ = uVar45;
  auVar55 = pmaddwd(auVar4,auVar55);
  auVar3._2_2_ = uStack_9c0;
  auVar3._0_2_ = uStack_9b0;
  auVar3._4_2_ = uStack_9ae;
  auVar3._6_2_ = uStack_9be;
  auVar3._10_2_ = uStack_9bc;
  auVar3._8_2_ = uStack_9ac;
  auVar3._12_2_ = uStack_9aa;
  auVar3._14_2_ = uStack_9ba;
  auVar56._8_8_ = uVar46;
  auVar56._0_8_ = uVar45;
  auVar56 = pmaddwd(auVar3,auVar56);
  auVar54._2_2_ = local_a48;
  auVar54._0_2_ = local_a38;
  auVar54._4_2_ = uStack_a36;
  auVar54._6_2_ = uStack_a46;
  auVar54._10_2_ = uStack_a44;
  auVar54._8_2_ = uStack_a34;
  auVar54._12_2_ = uStack_a32;
  auVar54._14_2_ = uStack_a42;
  auVar53._8_8_ = uVar48;
  auVar53._0_8_ = uVar47;
  auVar53 = pmaddwd(auVar54,auVar53);
  auVar51._2_2_ = uStack_9c0;
  auVar51._0_2_ = uStack_9b0;
  auVar51._4_2_ = uStack_9ae;
  auVar51._6_2_ = uStack_9be;
  auVar51._10_2_ = uStack_9bc;
  auVar51._8_2_ = uStack_9ac;
  auVar51._12_2_ = uStack_9aa;
  auVar51._14_2_ = uStack_9ba;
  auVar52._8_8_ = uVar48;
  auVar52._0_8_ = uVar47;
  auVar52 = pmaddwd(auVar51,auVar52);
  local_6d8 = auVar55._0_4_;
  iStack_6d4 = auVar55._4_4_;
  iStack_6d0 = auVar55._8_4_;
  iStack_6cc = auVar55._12_4_;
  local_6f8 = auVar56._0_4_;
  iStack_6f4 = auVar56._4_4_;
  iStack_6f0 = auVar56._8_4_;
  iStack_6ec = auVar56._12_4_;
  local_718 = auVar53._0_4_;
  iStack_714 = auVar53._4_4_;
  iStack_710 = auVar53._8_4_;
  iStack_70c = auVar53._12_4_;
  local_738 = auVar52._0_4_;
  iStack_734 = auVar52._4_4_;
  iStack_730 = auVar52._8_4_;
  iStack_72c = auVar52._12_4_;
  auVar52 = ZEXT416((uint)(int)in_DL);
  auVar51 = ZEXT416((uint)(int)in_DL);
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar32._4_4_ = iStack_6d4 + iStack_564 >> auVar52;
  auVar32._0_4_ = local_6d8 + local_568 >> auVar52;
  auVar32._12_4_ = iStack_6cc + iStack_55c >> auVar52;
  auVar32._8_4_ = iStack_6d0 + iStack_560 >> auVar52;
  auVar31._4_4_ = iStack_6f4 + iStack_564 >> auVar51;
  auVar31._0_4_ = local_6f8 + local_568 >> auVar51;
  auVar31._12_4_ = iStack_6ec + iStack_55c >> auVar51;
  auVar31._8_4_ = iStack_6f0 + iStack_560 >> auVar51;
  auVar52 = packssdw(auVar32,auVar31);
  in_RDI[0x17] = auVar52;
  auVar30._4_4_ = iStack_714 + iStack_564 >> auVar53;
  auVar30._0_4_ = local_718 + local_568 >> auVar53;
  auVar30._12_4_ = iStack_70c + iStack_55c >> auVar53;
  auVar30._8_4_ = iStack_710 + iStack_560 >> auVar53;
  auVar29._4_4_ = iStack_734 + iStack_564 >> auVar54;
  auVar29._0_4_ = local_738 + local_568 >> auVar54;
  auVar29._12_4_ = iStack_72c + iStack_55c >> auVar54;
  auVar29._8_4_ = iStack_730 + iStack_560 >> auVar54;
  auVar52 = packssdw(auVar30,auVar29);
  in_RDI[0x18] = auVar52;
  return;
}

Assistant:

static inline void idct32_stage8_sse2(__m128i *x, const int32_t *cospi,
                                      const __m128i __rounding,
                                      int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_sse2(x[0], x[15]);
  btf_16_adds_subs_sse2(x[1], x[14]);
  btf_16_adds_subs_sse2(x[2], x[13]);
  btf_16_adds_subs_sse2(x[3], x[12]);
  btf_16_adds_subs_sse2(x[4], x[11]);
  btf_16_adds_subs_sse2(x[5], x[10]);
  btf_16_adds_subs_sse2(x[6], x[9]);
  btf_16_adds_subs_sse2(x[7], x[8]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[20], x[27], x[20], x[27]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[21], x[26], x[21], x[26]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[22], x[25], x[22], x[25]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[23], x[24], x[23], x[24]);
}